

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::~SmallArray
          (SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U> *this)

{
  FixupPoint *pFVar1;
  
  pFVar1 = this->data;
  if (pFVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pFVar1 != (FixupPoint *)0x0) {
        (*(code *)NULLC::dealloc)(pFVar1);
      }
    }
    else if (pFVar1 != (FixupPoint *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}